

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QPDF_encryption.cc
# Opt level: O1

void compute_O_rc4_key(string *user_password,string *owner_password,EncryptionData *data,uchar *key)

{
  logic_error *this;
  int key_len;
  uchar *md;
  int iterations;
  size_t extraout_RDX;
  size_t extraout_RDX_00;
  size_t n;
  string *d;
  MD5 md5;
  Digest digest;
  string password;
  MD5 MStack_78;
  string local_68;
  string local_48;
  
  if (data->V < 5) {
    d = (string *)(owner_password->_M_dataplus)._M_p;
    md = key;
    local_48._M_dataplus._M_p = (pointer)&local_48.field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_48,d,
               (uchar *)((long)&(d->_M_dataplus)._M_p + owner_password->_M_string_length));
    n = extraout_RDX;
    if (local_48._M_string_length == 0) {
      std::__cxx11::string::_M_assign((string *)&local_48);
      n = extraout_RDX_00;
      d = user_password;
    }
    MD5::MD5(&MStack_78,(uchar *)d,n,md);
    pad_or_truncate_password_V4(&local_68,&local_48);
    MD5::encodeDataIncrementally(&MStack_78,local_68._M_dataplus._M_p,0x20);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_68._M_dataplus._M_p != &local_68.field_2) {
      operator_delete(local_68._M_dataplus._M_p,local_68.field_2._M_allocated_capacity + 1);
    }
    key_len = 0x10;
    if (data->Length_bytes < 0x10) {
      key_len = data->Length_bytes;
    }
    iterations = 0x32;
    if (data->R < 3) {
      iterations = 0;
    }
    iterate_md5_digest(&MStack_78,(Digest *)&local_68,iterations,key_len);
    *(pointer *)key = local_68._M_dataplus._M_p;
    *(size_type *)(key + 8) = local_68._M_string_length;
    if (MStack_78.crypto.super___shared_ptr<QPDFCryptoImpl,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
        _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                (MStack_78.crypto.super___shared_ptr<QPDFCryptoImpl,_(__gnu_cxx::_Lock_policy)2>.
                 _M_refcount._M_pi);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_48._M_dataplus._M_p != &local_48.field_2) {
      operator_delete(local_48._M_dataplus._M_p,local_48.field_2._M_allocated_capacity + 1);
    }
    return;
  }
  this = (logic_error *)__cxa_allocate_exception(0x10);
  std::logic_error::logic_error(this,"compute_O_rc4_key called for file with V >= 5");
  __cxa_throw(this,&std::logic_error::typeinfo,std::logic_error::~logic_error);
}

Assistant:

static void
compute_O_rc4_key(
    std::string const& user_password,
    std::string const& owner_password,
    QPDF::EncryptionData const& data,
    unsigned char key[OU_key_bytes_V4])
{
    if (data.getV() >= 5) {
        throw std::logic_error("compute_O_rc4_key called for file with V >= 5");
    }
    std::string password = owner_password;
    if (password.empty()) {
        password = user_password;
    }
    MD5 md5;
    md5.encodeDataIncrementally(pad_or_truncate_password_V4(password).c_str(), key_bytes);
    MD5::Digest digest;
    int key_len = std::min(QIntC::to_int(sizeof(digest)), data.getLengthBytes());
    iterate_md5_digest(md5, digest, ((data.getR() >= 3) ? 50 : 0), key_len);
    memcpy(key, digest, OU_key_bytes_V4);
}